

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,position2di *pos,rect<int> *clip,SColor *color,
          u32 starttime,u32 currenttime,bool loop,bool center)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  pointer prVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  position2di local_38;
  
  lVar2 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
  uVar8 = (ulong)index;
  if (index < (uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar2) >> 3)
                    * -0x33333333)) {
    uVar10 = (ulong)(*(long *)(lVar2 + 8 + uVar8 * 0x28) - *(long *)(lVar2 + uVar8 * 0x28)) >> 3;
    uVar9 = (uint)uVar10;
    bVar11 = uVar9 != 0;
    uVar7 = 0;
    if (bVar11) {
      uVar1 = *(uint *)(lVar2 + uVar8 * 0x28 + 0x20);
      bVar11 = true;
      if (uVar1 != 0) {
        uVar3 = (ulong)(currenttime - starttime) / (ulong)uVar1;
        if (loop) {
          uVar7 = uVar3 % (uVar10 & 0xffffffff);
        }
        else {
          uVar7 = (ulong)(uVar9 - 1);
          if ((uint)uVar3 < uVar9) {
            uVar7 = uVar3;
          }
        }
      }
    }
  }
  else {
    bVar11 = false;
    uVar7 = 0;
  }
  if (bVar11) {
    iVar5 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                      (this,(ulong)*(uint *)(*(long *)(lVar2 + uVar8 * 0x28) + uVar7 * 8));
    if (CONCAT44(extraout_var,iVar5) != 0) {
      prVar6 = (this->Rectangles).m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 + uVar8 * 0x28) +
                        4 + uVar7 * 8);
      if (uVar9 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar6) >>
                        4)) {
        prVar6 = prVar6 + uVar9;
        local_38 = *pos;
        if (center) {
          iVar4 = local_38.Y;
          local_38.X = local_38.X - ((prVar6->LowerRightCorner).X - (prVar6->UpperLeftCorner).X) / 2
          ;
          local_38.Y = iVar4 - ((prVar6->LowerRightCorner).Y - (prVar6->UpperLeftCorner).Y) / 2;
        }
        (*this->Driver->_vptr_IVideoDriver[0x30])
                  (this->Driver,CONCAT44(extraout_var,iVar5),&local_38,prVar6,clip,
                   (ulong)color->color,1);
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::position2di &pos,
		const core::rect<s32> *clip, const video::SColor &color,
		u32 starttime, u32 currenttime, bool loop, bool center)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, currenttime - starttime, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	const core::rect<s32> &r = Rectangles[rn];
	core::position2di p(pos);
	if (center) {
		p -= r.getSize() / 2;
	}
	Driver->draw2DImage(tex, p, r, clip, color, true);
}